

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::UnrelatedUploadRenderTimeCase::runSample
          (UnrelatedUploadRenderTimeCase *this,SampleResult *sample)

{
  pointer *this_00;
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  void *dst;
  Exception *this_01;
  UnmapFailureError *this_02;
  PixelBufferAccess local_140;
  undefined1 local_112;
  allocator<char> local_111;
  string local_110;
  char local_e9;
  void *pvStack_e8;
  GLboolean unmapSuccessful;
  void *mapPtr;
  deUint64 endTime;
  deUint64 startTime;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexData;
  int renderUploadSize;
  int unrelatedUploadSize;
  Buffer unrelatedBuffer;
  Buffer indexBuffer;
  undefined1 local_58 [8];
  Buffer arrayBuffer;
  undefined1 local_38 [4];
  int numVertices;
  Surface resultSurface;
  Functions *gl;
  SampleResult *sample_local;
  UnrelatedUploadRenderTimeCase *this_local;
  
  pRVar5 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  resultSurface.m_pixels.m_cap = CONCAT44(extraout_var,iVar2);
  tcu::Surface::Surface((Surface *)local_38,0x80,0x80);
  arrayBuffer.super_ObjectWrapper._20_4_ = getLayeredGridNumVertices(&sample->scene);
  pRVar5 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_58,pRVar5);
  pRVar5 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&unrelatedBuffer.super_ObjectWrapper.m_object
             ,pRVar5);
  pRVar5 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&renderUploadSize,pRVar5);
  vertexData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  this_00 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&startTime);
  generateLayeredGridVertexAttribData4C4V
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_00,
             &sample->scene);
  sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar2 = (int)sVar6 << 4;
  pcVar1 = *(code **)(resultSurface.m_pixels.m_cap + 0x40);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_58);
  (*pcVar1)(0x8892,dVar3);
  pcVar1 = *(code **)(resultSurface.m_pixels.m_cap + 0x150);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  (*pcVar1)(0x8892,(long)iVar2,pvVar7,0x88e4);
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    generateLayeredGridIndexData
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&startTime,&sample->scene);
    pcVar1 = *(code **)(resultSurface.m_pixels.m_cap + 0x40);
    dVar3 = glu::ObjectWrapper::operator*
                      ((ObjectWrapper *)&unrelatedBuffer.super_ObjectWrapper.m_object);
    (*pcVar1)(0x8893,dVar3);
    pcVar1 = *(code **)(resultSurface.m_pixels.m_cap + 0x150);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&startTime);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&startTime,0);
    (*pcVar1)(0x8893,(long)((int)sVar6 << 2),pvVar8,0x88e4);
  }
  RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(resultSurface.m_pixels.m_cap + 0x538))(4,0,arrayBuffer.super_ObjectWrapper._20_4_);
  }
  else if ((this->
           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
           ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(resultSurface.m_pixels.m_cap + 0x568))
              (4,arrayBuffer.super_ObjectWrapper._20_4_,0x1405,0);
  }
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  (**(code **)(resultSurface.m_pixels.m_cap + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(resultSurface.m_pixels.m_cap + 0x188))(0x4000);
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  tcu::warmupCPU();
  if (*(int *)&(this->
               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
               ).field_0xcc == 0) {
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    vertexData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar6 << 4;
    pcVar1 = *(code **)(resultSurface.m_pixels.m_cap + 0x40);
    dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&renderUploadSize);
    (*pcVar1)(0x8892,dVar3);
    pcVar1 = *(code **)(resultSurface.m_pixels.m_cap + 0x150);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    (*pcVar1)(0x8892,(long)vertexData.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,pvVar7,0x88e4);
  }
  else if (*(int *)&(this->
                    super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                    ).field_0xcc == 1) {
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    vertexData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar6 << 4;
    pcVar1 = *(code **)(resultSurface.m_pixels.m_cap + 0x40);
    dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&renderUploadSize);
    (*pcVar1)(0x8892,dVar3);
    (**(code **)(resultSurface.m_pixels.m_cap + 0x150))
              (0x8892,(long)vertexData.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,0x88e4);
    pcVar1 = *(code **)(resultSurface.m_pixels.m_cap + 0x168);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    (*pcVar1)(0x8892,0,(long)vertexData.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,pvVar7);
  }
  else if (*(int *)&(this->
                    super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                    ).field_0xcc == 2) {
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    vertexData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar6 << 4;
    pcVar1 = *(code **)(resultSurface.m_pixels.m_cap + 0x40);
    dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&renderUploadSize);
    (*pcVar1)(0x8892,dVar3);
    (**(code **)(resultSurface.m_pixels.m_cap + 0x150))
              (0x8892,(long)vertexData.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,0x88e4);
    dst = (void *)(**(code **)(resultSurface.m_pixels.m_cap + 0xd00))
                            (0x8892,0,(long)vertexData.
                                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                             ,0x2e);
    pvStack_e8 = dst;
    if (dst == (void *)0x0) {
      local_112 = 1;
      this_01 = (Exception *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"MapBufferRange returned NULL",&local_111);
      tcu::Exception::Exception(this_01,&local_110);
      local_112 = 0;
      __cxa_throw(this_01,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
    }
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    ::deMemcpy(dst,pvVar7,
               (long)vertexData.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    local_e9 = (**(code **)(resultSurface.m_pixels.m_cap + 0x1670))(0x8892);
    if (local_e9 == '\0') {
      this_02 = (UnmapFailureError *)__cxa_allocate_exception(8);
      UnmapFailureError::UnmapFailureError(this_02);
      __cxa_throw(this_02,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                  UnmapFailureError::~UnmapFailureError);
    }
  }
  endTime = deGetMicroseconds();
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(resultSurface.m_pixels.m_cap + 0x538))(4,0,arrayBuffer.super_ObjectWrapper._20_4_);
  }
  else if ((this->
           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
           ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(resultSurface.m_pixels.m_cap + 0x568))
              (4,arrayBuffer.super_ObjectWrapper._20_4_,0x1405,0);
  }
  mapPtr = (void *)deGetMicroseconds();
  (sample->result).duration.renderDuration = (long)mapPtr - endTime;
  endTime = deGetMicroseconds();
  pRVar5 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  tcu::Surface::getAccess(&local_140,(Surface *)local_38);
  glu::readPixels(pRVar5,0,0,&local_140);
  mapPtr = (void *)deGetMicroseconds();
  (sample->result).duration.readDuration = (long)mapPtr - endTime;
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
          ::getVertexDataSize(&this->
                               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                             );
  (sample->result).renderDataSize = iVar4 * (sample->result).numVertices;
  (sample->result).uploadedDataSize = iVar2;
  (sample->result).unrelatedDataSize =
       vertexData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  (sample->result).duration.renderReadDuration =
       (sample->result).duration.renderDuration + (sample->result).duration.readDuration;
  (sample->result).duration.totalDuration =
       (sample->result).duration.renderDuration + (sample->result).duration.readDuration;
  (sample->result).duration.fitResponseDuration = (sample->result).duration.renderReadDuration;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&startTime);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&renderUploadSize);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&unrelatedBuffer.super_ObjectWrapper.m_object
            );
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_58);
  tcu::Surface::~Surface((Surface *)local_38);
  return;
}

Assistant:

void UnrelatedUploadRenderTimeCase::runSample (SampleResult& sample)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	tcu::Surface			resultSurface		(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	const int				numVertices			= getLayeredGridNumVertices(sample.scene);
	const glu::Buffer		arrayBuffer			(m_context.getRenderContext());
	const glu::Buffer		indexBuffer			(m_context.getRenderContext());
	const glu::Buffer		unrelatedBuffer		(m_context.getRenderContext());
	int						unrelatedUploadSize	= -1;
	int						renderUploadSize;
	std::vector<tcu::Vec4>	vertexData;
	std::vector<deUint32>	indexData;
	deUint64				startTime;
	deUint64				endTime;

	// generate and upload buffers

	generateLayeredGridVertexAttribData4C4V(vertexData, sample.scene);
	renderUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

	gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, renderUploadSize, &vertexData[0], GL_STATIC_DRAW);

	if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
	{
		generateLayeredGridIndexData(indexData, sample.scene);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STATIC_DRAW);
	}

	setupVertexAttribs();

	// make sure data is uploaded

	if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
	else
		DE_ASSERT(false);
	waitGLResults();

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	waitGLResults();

	tcu::warmupCPU();

	// Unrelated upload
	if (m_unrelatedUploadMethod == UPLOADMETHOD_BUFFER_DATA)
	{
		unrelatedUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

		gl.bindBuffer(GL_ARRAY_BUFFER, *unrelatedBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, unrelatedUploadSize, &vertexData[0], GL_STATIC_DRAW);
	}
	else if (m_unrelatedUploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA)
	{
		unrelatedUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

		gl.bindBuffer(GL_ARRAY_BUFFER, *unrelatedBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, unrelatedUploadSize, DE_NULL, GL_STATIC_DRAW);
		gl.bufferSubData(GL_ARRAY_BUFFER, 0, unrelatedUploadSize, &vertexData[0]);
	}
	else if (m_unrelatedUploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE)
	{
		void*			mapPtr;
		glw::GLboolean	unmapSuccessful;

		unrelatedUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

		gl.bindBuffer(GL_ARRAY_BUFFER, *unrelatedBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, unrelatedUploadSize, DE_NULL, GL_STATIC_DRAW);

		mapPtr = gl.mapBufferRange(GL_ARRAY_BUFFER, 0, unrelatedUploadSize, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_RANGE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT | GL_MAP_UNSYNCHRONIZED_BIT);
		if (!mapPtr)
			throw tcu::Exception("MapBufferRange returned NULL");

		deMemcpy(mapPtr, &vertexData[0], unrelatedUploadSize);

		// if unmapping fails, just try again later
		unmapSuccessful = gl.unmapBuffer(GL_ARRAY_BUFFER);
		if (!unmapSuccessful)
			throw UnmapFailureError();
	}
	else
		DE_ASSERT(false);

	DE_ASSERT(unrelatedUploadSize != -1);

	// Measure both draw and associated readpixels
	{
		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.renderDuration = endTime - startTime;
	}

	{
		startTime = deGetMicroseconds();
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
		endTime = deGetMicroseconds();

		sample.result.duration.readDuration = endTime - startTime;
	}

	sample.result.renderDataSize = getVertexDataSize() * sample.result.numVertices;
	sample.result.uploadedDataSize = renderUploadSize;
	sample.result.unrelatedDataSize = unrelatedUploadSize;
	sample.result.duration.renderReadDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.totalDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.fitResponseDuration = sample.result.duration.renderReadDuration;
}